

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Object * __thiscall ICM::Interpreter::getObject(Interpreter *this,Element *element)

{
  bool bVar1;
  size_t __n;
  reference ppOVar2;
  Element *element_local;
  Interpreter *this_local;
  
  bVar1 = Instruction::Element::isLiteral(element);
  if (bVar1) {
    this_local = (Interpreter *)createObjectFromLiteral(element,this->EP);
  }
  else {
    bVar1 = Instruction::Element::isRefer(element);
    if (bVar1) {
      __n = Instruction::Element::getRefer(element);
      ppOVar2 = std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::operator[]
                          (&this->TempResult,__n);
      this_local = (Interpreter *)*ppOVar2;
    }
    else {
      bVar1 = Instruction::Element::isIdent(element);
      if (bVar1) {
        this_local = (Interpreter *)getIdentData(element);
      }
      else {
        println<char[20]>((char (*) [20])"Error in getObject.");
        this_local = (Interpreter *)0x0;
      }
    }
  }
  return (Object *)this_local;
}

Assistant:

Object* getObject(const Instruction::Element &element) {
			if (element.isLiteral()) {
				return createObjectFromLiteral(element, EP);
			}
			else if (element.isRefer()) {
				return TempResult[element.getRefer()];
			}
			else if (element.isIdent()) {
				return getIdentData(element);
			}
			else {
				println("Error in getObject.");
				return nullptr;
			}
		}